

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void capnp::_::setGlobalBrokenCapFactoryForLayoutCpp(BrokenCapFactory *factory)

{
  globalBrokenCapFactory = factory;
  return;
}

Assistant:

void setGlobalBrokenCapFactoryForLayoutCpp(BrokenCapFactory& factory) {
  // Called from capability.c++ when the capability API is used, to make sure that layout.c++
  // is ready for it.  May be called multiple times but always with the same value.
#if __GNUC__ || defined(__clang__)
  __atomic_store_n(&globalBrokenCapFactory, &factory, __ATOMIC_RELAXED);
#elif _MSC_VER
  *static_cast<BrokenCapFactory* volatile*>(&globalBrokenCapFactory) = &factory;
#else
#error "Platform not supported"
#endif
}